

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_gen_prime
              (mbedtls_mpi *X,size_t nbits,int dh_flag,_func_int_void_ptr_uchar_ptr_size_t *f_rng,
              void *p_rng)

{
  size_t sVar1;
  undefined1 local_70 [8];
  mbedtls_mpi Y;
  mbedtls_mpi_uint r;
  size_t n;
  size_t k;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  int dh_flag_local;
  size_t nbits_local;
  mbedtls_mpi *X_local;
  
  if ((nbits < 3) || (0x2000 < nbits)) {
    return -4;
  }
  mbedtls_mpi_init((mbedtls_mpi *)local_70);
  k._4_4_ = mbedtls_mpi_fill_random
                      (X,((nbits >> 6) + (long)(int)(uint)((nbits & 0x3f) != 0)) * 8,f_rng,p_rng);
  if ((k._4_4_ != 0) ||
     ((sVar1 = mbedtls_mpi_bitlen(X), nbits < sVar1 &&
      (k._4_4_ = mbedtls_mpi_shift_r(X,(sVar1 - nbits) + 1), k._4_4_ != 0)))) goto LAB_001c0aff;
  mbedtls_mpi_set_bit(X,nbits - 1,'\x01');
  *X->p = *X->p | 1;
  if (dh_flag == 0) {
    do {
      k._4_4_ = mbedtls_mpi_is_prime(X,f_rng,p_rng);
      if ((k._4_4_ == 0) || (k._4_4_ != -0xe)) break;
      k._4_4_ = mbedtls_mpi_add_int(X,X,2);
    } while (k._4_4_ == 0);
    goto LAB_001c0aff;
  }
  *X->p = *X->p | 2;
  k._4_4_ = mbedtls_mpi_mod_int((mbedtls_mpi_uint *)&Y.p,X,3);
  if (k._4_4_ != 0) goto LAB_001c0aff;
  if (Y.p == (mbedtls_mpi_uint *)0x0) {
    k._4_4_ = mbedtls_mpi_add_int(X,X,8);
joined_r0x001c0a0d:
    if (k._4_4_ != 0) goto LAB_001c0aff;
  }
  else if (Y.p == (mbedtls_mpi_uint *)0x1) {
    k._4_4_ = mbedtls_mpi_add_int(X,X,4);
    goto joined_r0x001c0a0d;
  }
  k._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)local_70,X);
  if ((k._4_4_ == 0) && (k._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)local_70,1), k._4_4_ == 0)) {
    while ((k._4_4_ = mpi_check_small_factors(X), k._4_4_ != 0 ||
           (((k._4_4_ = mpi_check_small_factors((mbedtls_mpi *)local_70), k._4_4_ != 0 ||
             (k._4_4_ = mpi_miller_rabin(X,f_rng,p_rng), k._4_4_ != 0)) ||
            (k._4_4_ = mpi_miller_rabin((mbedtls_mpi *)local_70,f_rng,p_rng), k._4_4_ != 0))))) {
      if (((k._4_4_ != -0xe) || (k._4_4_ = mbedtls_mpi_add_int(X,X,0xc), k._4_4_ != 0)) ||
         (k._4_4_ = mbedtls_mpi_add_int((mbedtls_mpi *)local_70,(mbedtls_mpi *)local_70,6),
         k._4_4_ != 0)) break;
    }
  }
LAB_001c0aff:
  mbedtls_mpi_free((mbedtls_mpi *)local_70);
  return k._4_4_;
}

Assistant:

int mbedtls_mpi_gen_prime( mbedtls_mpi *X, size_t nbits, int dh_flag,
                   int (*f_rng)(void *, unsigned char *, size_t),
                   void *p_rng )
{
    int ret;
    size_t k, n;
    mbedtls_mpi_uint r;
    mbedtls_mpi Y;

    if( nbits < 3 || nbits > MBEDTLS_MPI_MAX_BITS )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    mbedtls_mpi_init( &Y );

    n = BITS_TO_LIMBS( nbits );

    MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( X, n * ciL, f_rng, p_rng ) );

    k = mbedtls_mpi_bitlen( X );
    if( k > nbits ) MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( X, k - nbits + 1 ) );

    mbedtls_mpi_set_bit( X, nbits-1, 1 );

    X->p[0] |= 1;

    if( dh_flag == 0 )
    {
        while( ( ret = mbedtls_mpi_is_prime( X, f_rng, p_rng ) ) != 0 )
        {
            if( ret != MBEDTLS_ERR_MPI_NOT_ACCEPTABLE )
                goto cleanup;

            MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( X, X, 2 ) );
        }
    }
    else
    {
        /*
         * An necessary condition for Y and X = 2Y + 1 to be prime
         * is X = 2 mod 3 (which is equivalent to Y = 2 mod 3).
         * Make sure it is satisfied, while keeping X = 3 mod 4
         */

        X->p[0] |= 2;

        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_int( &r, X, 3 ) );
        if( r == 0 )
            MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( X, X, 8 ) );
        else if( r == 1 )
            MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( X, X, 4 ) );

        /* Set Y = (X-1) / 2, which is X / 2 because X is odd */
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &Y, X ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &Y, 1 ) );

        while( 1 )
        {
            /*
             * First, check small factors for X and Y
             * before doing Miller-Rabin on any of them
             */
            if( ( ret = mpi_check_small_factors(  X         ) ) == 0 &&
                ( ret = mpi_check_small_factors( &Y         ) ) == 0 &&
                ( ret = mpi_miller_rabin(  X, f_rng, p_rng  ) ) == 0 &&
                ( ret = mpi_miller_rabin( &Y, f_rng, p_rng  ) ) == 0 )
            {
                break;
            }

            if( ret != MBEDTLS_ERR_MPI_NOT_ACCEPTABLE )
                goto cleanup;

            /*
             * Next candidates. We want to preserve Y = (X-1) / 2 and
             * Y = 1 mod 2 and Y = 2 mod 3 (eq X = 3 mod 4 and X = 2 mod 3)
             * so up Y by 6 and X by 12.
             */
            MBEDTLS_MPI_CHK( mbedtls_mpi_add_int(  X,  X, 12 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( &Y, &Y, 6  ) );
        }
    }

cleanup:

    mbedtls_mpi_free( &Y );

    return( ret );
}